

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_mem.c
# Opt level: O0

int mem_buf_free(BIO *a)

{
  BUF_MEM *a_00;
  long in_RDI;
  BUF_MEM *b;
  BIO_BUF_MEM *bb;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    if (((*(int *)(in_RDI + 0x2c) != 0) && (*(int *)(in_RDI + 0x28) != 0)) &&
       (*(long *)(in_RDI + 0x40) != 0)) {
      a_00 = (BUF_MEM *)**(undefined8 **)(in_RDI + 0x40);
      if ((*(uint *)(in_RDI + 0x30) & 0x200) != 0) {
        a_00->data = (char *)0x0;
      }
      BUF_MEM_free(a_00);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int mem_buf_free(BIO *a)
{
    if (a == NULL)
        return 0;

    if (a->shutdown && a->init && a->ptr != NULL) {
        BIO_BUF_MEM *bb = (BIO_BUF_MEM *)a->ptr;
        BUF_MEM *b = bb->buf;

        if (a->flags & BIO_FLAGS_MEM_RDONLY)
            b->data = NULL;
        BUF_MEM_free(b);
    }
    return 1;
}